

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O0

void __thiscall PyreNet::Layer::mutate_gaussian(Layer *this,double mean,double std)

{
  bool bVar1;
  reference this_00;
  Perceptron *p;
  iterator __end1;
  iterator __begin1;
  vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_> *__range1;
  double std_local;
  double mean_local;
  Layer *this_local;
  
  __end1 = ::std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::begin
                     (&this->nodes);
  p = (Perceptron *)
      ::std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>::end(&this->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
                                *)&p);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
              ::operator*(&__end1);
    Perceptron::mutate_gaussian(this_00,mean,std);
    __gnu_cxx::
    __normal_iterator<PyreNet::Perceptron_*,_std::vector<PyreNet::Perceptron,_std::allocator<PyreNet::Perceptron>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Layer::mutate_gaussian(const double mean, const double std) {
        for (Perceptron &p : this->nodes) {
            p.mutate_gaussian(mean, std);
        }
    }